

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

string * __thiscall
clipp::usage_lines::param_label_abi_cxx11_
          (string *__return_storage_ptr__,usage_lines *this,parameter *p,context *cur)

{
  bool bVar1;
  group *this_00;
  size_type sVar2;
  string *psVar3;
  size_type sVar4;
  int *piVar5;
  const_reference pvVar6;
  ulong uVar7;
  doc_string *__rhs;
  string *__rhs_00;
  byte local_141;
  byte local_133;
  byte local_132;
  bool local_131;
  bool local_111;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  int local_84;
  char local_7e;
  byte local_7d;
  int i;
  bool sep;
  int iStack_78;
  bool surrAlt;
  int local_74;
  arg_list *paStack_70;
  int n;
  arg_list *flags;
  string local_58 [8];
  string lbl;
  bool showrep;
  bool showopt;
  bool outermost;
  bool startsOptionalSequence;
  group *parent;
  context *cur_local;
  parameter *p_local;
  usage_lines *this_local;
  
  this_00 = group::depth_first_traverser::parent(&cur->pos);
  sVar2 = group::size(this_00);
  local_111 = false;
  if (1 < sVar2) {
    bVar1 = detail::token<clipp::parameter>::blocking(&p->super_token<clipp::parameter>);
    local_111 = false;
    if (bVar1) {
      local_111 = group::depth_first_traverser::is_first_in_parent(&cur->pos);
    }
  }
  lbl.field_2._M_local_buf[0xf] = local_111;
  local_131 = false;
  if ((this->ommitOutermostSurrounders_ & 1U) != 0) {
    local_131 = cur->outermost == this_00;
  }
  lbl.field_2._M_local_buf[0xe] = local_131;
  bVar1 = context::is_alternative(cur);
  local_132 = 0;
  if (!bVar1) {
    bVar1 = parameter::required(p);
    local_132 = 0;
    if ((!bVar1) && (local_132 = 0, (lbl.field_2._M_local_buf[0xf] & 1U) == 0)) {
      local_132 = lbl.field_2._M_local_buf[0xe] ^ 0xff;
    }
  }
  lbl.field_2._M_local_buf[0xd] = local_132 & 1;
  bVar1 = detail::token<clipp::parameter>::repeatable(&p->super_token<clipp::parameter>);
  local_133 = 0;
  if (bVar1) {
    local_133 = lbl.field_2._M_local_buf[0xe] ^ 0xff;
  }
  lbl.field_2._M_local_buf[0xc] = local_133 & 1;
  std::__cxx11::string::string(local_58);
  if ((lbl.field_2._M_local_buf[0xc] & 1U) != 0) {
    psVar3 = doc_formatting::repeat_prefix_abi_cxx11_(&this->fmt_);
    std::__cxx11::string::operator+=(local_58,(string *)psVar3);
  }
  if ((lbl.field_2._M_local_buf[0xd] & 1U) != 0) {
    psVar3 = doc_formatting::optional_prefix_abi_cxx11_(&this->fmt_);
    std::__cxx11::string::operator+=(local_58,(string *)psVar3);
  }
  paStack_70 = parameter::flags_abi_cxx11_(p);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(paStack_70);
  if (bVar1) {
    parameter::label_abi_cxx11_(p);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      psVar3 = doc_formatting::label_prefix_abi_cxx11_(&this->fmt_);
      __rhs = parameter::label_abi_cxx11_(p);
      std::operator+(&local_c8,psVar3,__rhs);
      psVar3 = doc_formatting::label_postfix_abi_cxx11_(&this->fmt_);
      std::operator+(&local_a8,&local_c8,psVar3);
      std::__cxx11::string::operator+=(local_58,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    else {
      doc_formatting::empty_label_abi_cxx11_(&this->fmt_);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",&local_109);
        std::allocator<char>::~allocator(&local_109);
        goto LAB_00127964;
      }
      psVar3 = doc_formatting::label_prefix_abi_cxx11_(&this->fmt_);
      __rhs_00 = doc_formatting::empty_label_abi_cxx11_(&this->fmt_);
      std::operator+(&local_108,psVar3,__rhs_00);
      psVar3 = doc_formatting::label_postfix_abi_cxx11_(&this->fmt_);
      std::operator+(&local_e8,&local_108,psVar3);
      std::__cxx11::string::operator+=(local_58,(string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
    }
  }
  else {
    iStack_78 = doc_formatting::max_flags_per_param_in_usage(&this->fmt_);
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(paStack_70);
    i = (int)sVar4;
    piVar5 = std::min<int>(&stack0xffffffffffffff88,&i);
    local_74 = *piVar5;
    local_141 = 0;
    if ((1 < local_74) && (local_141 = 0, (lbl.field_2._M_local_buf[0xd] & 1U) == 0)) {
      bVar1 = context::is_singleton(cur);
      local_141 = bVar1 ^ 0xff;
    }
    local_7d = local_141 & 1;
    if (local_7d != 0) {
      psVar3 = doc_formatting::alternative_flags_prefix_abi_cxx11_(&this->fmt_);
      std::__cxx11::string::operator+=(local_58,(string *)psVar3);
    }
    local_7e = '\0';
    for (local_84 = 0; local_84 < local_74; local_84 = local_84 + 1) {
      if (local_7e != '\0') {
        bVar1 = context::is_singleton(cur);
        if (bVar1) {
          psVar3 = doc_formatting::alternative_group_separator_abi_cxx11_(&this->fmt_);
          std::__cxx11::string::operator+=(local_58,(string *)psVar3);
        }
        else {
          psVar3 = doc_formatting::flag_separator_abi_cxx11_(&this->fmt_);
          std::__cxx11::string::operator+=(local_58,(string *)psVar3);
        }
      }
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](paStack_70,(long)local_84);
      std::__cxx11::string::operator+=(local_58,(string *)pvVar6);
      local_7e = '\x01';
    }
    if ((local_7d & 1) != 0) {
      psVar3 = doc_formatting::alternative_flags_postfix_abi_cxx11_(&this->fmt_);
      std::__cxx11::string::operator+=(local_58,(string *)psVar3);
    }
  }
  if ((lbl.field_2._M_local_buf[0xd] & 1U) != 0) {
    psVar3 = doc_formatting::optional_postfix_abi_cxx11_(&this->fmt_);
    std::__cxx11::string::operator+=(local_58,(string *)psVar3);
  }
  if ((lbl.field_2._M_local_buf[0xc] & 1U) != 0) {
    psVar3 = doc_formatting::repeat_postfix_abi_cxx11_(&this->fmt_);
    std::__cxx11::string::operator+=(local_58,(string *)psVar3);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_58);
LAB_00127964:
  std::__cxx11::string::~string(local_58);
  return __return_storage_ptr__;
}

Assistant:

string param_label(const parameter& p, const context& cur) const
    {
        const auto& parent = cur.pos.parent();

        const bool startsOptionalSequence =
            parent.size() > 1 && p.blocking() && cur.pos.is_first_in_parent();

        const bool outermost =
            ommitOutermostSurrounders_ && cur.outermost == &parent;

        const bool showopt = !cur.is_alternative() && !p.required()
            && !startsOptionalSequence && !outermost;

        const bool showrep = p.repeatable() && !outermost;

        string lbl;

        if(showrep) lbl += fmt_.repeat_prefix();
        if(showopt) lbl += fmt_.optional_prefix();

        const auto& flags = p.flags();
        if(!flags.empty()) {
            const int n = std::min(fmt_.max_flags_per_param_in_usage(),
                                   int(flags.size()));

            const bool surrAlt = n > 1 && !showopt && !cur.is_singleton();

            if(surrAlt) lbl += fmt_.alternative_flags_prefix();
            bool sep = false;
            for(int i = 0; i < n; ++i) {
                if(sep) {
                    if(cur.is_singleton())
                        lbl += fmt_.alternative_group_separator();
                    else
                        lbl += fmt_.flag_separator();
                }
                lbl += flags[i];
                sep = true;
            }
            if(surrAlt) lbl += fmt_.alternative_flags_postfix();
        }
        else {
             if(!p.label().empty()) {
                 lbl += fmt_.label_prefix()
                     + p.label()
                     + fmt_.label_postfix();
             } else if(!fmt_.empty_label().empty()) {
                 lbl += fmt_.label_prefix()
                     + fmt_.empty_label()
                     + fmt_.label_postfix();
             } else {
                 return "";
             }
        }

        if(showopt) lbl += fmt_.optional_postfix();
        if(showrep) lbl += fmt_.repeat_postfix();

        return lbl;
    }